

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Real M_GetVal(Matrix *M,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return 0.0;
  }
  if (RoC == 0 || M->ElOrder != Rowws) {
    if (((M->ElOrder != Clmws || RoC == 0) || (M->ClmDim < RoC)) || (M->Len[RoC] <= Entry))
    goto LAB_00110676;
  }
  else if (M->RowDim < RoC) {
LAB_00110676:
    LASError(LASRangeErr,"M_GetVal",M->Name,(char *)0x0,(char *)0x0);
    return 0.0;
  }
  return M->El[RoC][Entry].Val;
}

Assistant:

Real M_GetVal(Matrix *M, size_t RoC, size_t Entry)
/* returns the value of a matrix entry */
{
    Real Val;

    if (LASResult() == LASOK)
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC]))) {
            Val = M->El[RoC][Entry].Val;
        } else {
            LASError(LASRangeErr, "M_GetVal", M->Name, NULL, NULL);
	    Val = 0.0;
	}
    else
        Val = 0.0;
    return(Val);
}